

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::remove_web_seed_conn(torrent *this,peer_connection *p)

{
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *plVar1;
  _List_node_base *p_Var2;
  iterator web;
  
  plVar1 = &this->m_web_seeds;
  p_Var2 = (_List_node_base *)&p->super_peer_connection_interface;
  web._M_node = (_List_node_base *)plVar1;
  if (p == (peer_connection *)0x0) {
    p_Var2 = (_List_node_base *)0x0;
  }
  do {
    web._M_node = (web._M_node)->_M_next;
    if (web._M_node == (_List_node_base *)plVar1) {
      return;
    }
  } while (web._M_node[9]._M_next != p_Var2);
  remove_web_seed_iter(this,web);
  return;
}

Assistant:

void torrent::remove_web_seed_conn(peer_connection* p)
	{
		auto const i = std::find_if(m_web_seeds.begin(), m_web_seeds.end()
			, [p] (web_seed_t const& ws) { return ws.peer_info.connection == p; });

		TORRENT_ASSERT(i != m_web_seeds.end());
		if (i == m_web_seeds.end()) return;
		remove_web_seed_iter(i);
	}